

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O1

void __thiscall
chrono::utils::ChISO2631_Shock_SeatCushionLogger::Config
          (ChISO2631_Shock_SeatCushionLogger *this,double step)

{
  this->m_step_inp = step;
  ChButterworth_Lowpass::Config(&this->m_lpx,4,step,75.0);
  ChButterworth_Lowpass::Config(&this->m_lpy,4,this->m_step_inp,75.0);
  ChButterworth_Lowpass::Config(&this->m_lpz,4,this->m_step_inp,75.0);
  ChButterworth_Lowpass::Config(&this->m_legacy_lpz,4,this->m_step_inp,30.0);
  Reset(this);
  return;
}

Assistant:

void ChISO2631_Shock_SeatCushionLogger::Config(double step) {
    m_step_inp = step;

    m_lpx.Config(4, m_step_inp, 75.0);
    m_lpy.Config(4, m_step_inp, 75.0);
    m_lpz.Config(4, m_step_inp, 75.0);

    m_legacy_lpz.Config(4, m_step_inp, 30.0);

    Reset();
}